

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O1

LY_ERR lyb_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  lys_module **pplVar1;
  bool bVar2;
  lyd_node_inner *plVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lyd_ctx *lydctx;
  anon_struct_24_3_37108ca1 *paVar6;
  lysc_node *plVar7;
  lyd_node_inner *plVar8;
  lys_module *plVar9;
  lyd_node_inner *plVar10;
  lylyb_ctx *lybctx;
  ly_ctx *ctx;
  ulong uVar11;
  lys_module *plVar12;
  uint8_t zero;
  ly_set *set;
  char magic_number [3];
  uint8_t local_69;
  ly_set *local_68;
  lyd_node_inner *local_60;
  lylyb_ctx *local_58;
  ly_out *local_50;
  lyd_node_inner *local_48;
  ulong local_40;
  lyd_node_inner *local_38;
  
  local_69 = '\0';
  if (root == (lyd_node *)0x0) {
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (root->schema == (lysc_node *)0x0) {
      plVar5 = (lys_module *)&root[2].schema;
    }
    else {
      plVar5 = root->schema->module;
    }
    ctx = plVar5->ctx;
  }
  lydctx = (lyd_ctx *)calloc(1,0x1080);
  if (lydctx != (lyd_ctx *)0x0) {
    paVar6 = (anon_struct_24_3_37108ca1 *)calloc(1,0x38);
    lydctx->data_ctx = paVar6;
    if (paVar6 != (anon_struct_24_3_37108ca1 *)0x0) {
      lydctx->parse_opts = options;
      if (root != (lyd_node *)0x0) {
        paVar6->ctx = ctx;
        if ((root->schema != (lysc_node *)0x0) &&
           (plVar7 = lysc_data_node(root->schema->parent), plVar7 != (lysc_node *)0x0)) {
          LVar4 = LY_EINVAL;
          ly_log(lydctx->data_ctx->ctx,LY_LLERR,LY_EINVAL,
                 "LYB printer supports only printing top-level nodes.");
          goto LAB_0013f0a1;
        }
      }
      local_40 = CONCAT53(local_40._3_5_,0x620000);
      local_40 = CONCAT62(local_40._2_6_,0x796c);
      local_48 = (lyd_node_inner *)root;
      LVar4 = ly_write_(out,(char *)&local_40,3);
      if (LVar4 == LY_SUCCESS) {
        local_40 = CONCAT71(local_40._1_7_,5);
        LVar4 = ly_write_(out,(char *)&local_40,1);
        if (LVar4 == LY_SUCCESS) {
          lybctx = (lylyb_ctx *)lydctx->data_ctx;
          LVar4 = ly_set_new(&local_68);
          if (LVar4 == LY_SUCCESS) {
            if (local_48 != (lyd_node_inner *)0x0) {
              LVar4 = LY_SUCCESS;
              plVar10 = local_48;
              plVar3 = local_48;
              local_58 = lybctx;
              local_50 = out;
LAB_0013f0fd:
              local_60 = plVar3;
              plVar7 = (plVar10->field_0).node.schema;
              if (plVar7 != (lysc_node *)0x0) {
                plVar5 = plVar7->module;
                local_38 = plVar10;
                LVar4 = ly_set_add(local_68,plVar5,'\0',(uint32_t *)0x0);
                if (LVar4 == LY_SUCCESS) {
                  plVar12 = (lys_module *)0x0;
                  do {
                    pplVar1 = plVar5->deviated_by;
                    if (pplVar1 == (lys_module **)0x0) {
                      plVar9 = (lys_module *)0x0;
                    }
                    else {
                      plVar9 = pplVar1[-1];
                    }
                    if (plVar9 <= plVar12) {
                      plVar12 = (lys_module *)0x0;
                      goto LAB_0013f16c;
                    }
                    LVar4 = ly_set_add(local_68,pplVar1[(long)plVar12],'\0',(uint32_t *)0x0);
                    plVar12 = (lys_module *)((long)&plVar12->ctx + 1);
                    out = local_50;
                  } while (LVar4 == LY_SUCCESS);
                }
                goto LAB_0013f225;
              }
LAB_0013f1b2:
              if (plVar7 == (lysc_node *)0x0) {
                plVar7 = (plVar10->field_0).node.schema;
                if ((plVar7 == (lysc_node *)0x0) || ((plVar7->nodetype & 0x711) != 0)) {
                  plVar8 = (lyd_node_inner *)plVar10->child;
                }
                else {
                  plVar8 = (lyd_node_inner *)0x0;
                }
              }
              else {
                plVar8 = (lyd_node_inner *)0x0;
              }
              if (plVar8 == (lyd_node_inner *)0x0) {
                if (plVar10 != local_60) {
                  plVar8 = (lyd_node_inner *)(plVar10->field_0).node.next;
                  goto LAB_0013f1ee;
                }
              }
              else {
LAB_0013f1ee:
                if (plVar8 == (lyd_node_inner *)0x0) {
                  do {
                    plVar10 = *(lyd_node_inner **)((long)&plVar10->field_0 + 0x10);
                    if ((plVar10->field_0).node.parent == (local_60->field_0).node.parent) break;
                    plVar8 = (lyd_node_inner *)(plVar10->field_0).node.next;
                  } while (plVar8 == (lyd_node_inner *)0x0);
                }
                plVar10 = plVar8;
                plVar3 = local_60;
                if (plVar8 != (lyd_node_inner *)0x0) goto LAB_0013f0fd;
              }
              bVar2 = true;
              goto LAB_0013f22f;
            }
LAB_0013f24d:
            local_40 = (ulong)local_68->count;
            LVar4 = lyb_write(out,(uint8_t *)&local_40,2,lybctx);
            if (LVar4 == LY_SUCCESS) {
              if (local_68->count != 0) {
                uVar11 = 0;
                do {
                  LVar4 = lyb_print_model(out,(lys_module *)(local_68->field_2).dnodes[uVar11],
                                          '\x01',lybctx);
                  if (LVar4 != LY_SUCCESS) goto LAB_0013f2b3;
                  uVar11 = uVar11 + 1;
                } while (uVar11 < local_68->count);
              }
              LVar4 = LY_SUCCESS;
            }
LAB_0013f2b3:
            ly_set_free(local_68,(_func_void_void_ptr *)0x0);
          }
          if ((LVar4 == LY_SUCCESS) &&
             (LVar4 = lyb_print_siblings(out,(lyd_node *)local_48,(lyd_lyb_ctx *)lydctx),
             LVar4 == LY_SUCCESS)) {
            LVar4 = lyb_write(out,&local_69,1,(lylyb_ctx *)lydctx->data_ctx);
          }
        }
      }
      goto LAB_0013f0a1;
    }
  }
  LVar4 = LY_EMEM;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_print_data");
LAB_0013f0a1:
  lyd_lyb_ctx_free(lydctx);
  return LVar4;
  while( true ) {
    LVar4 = ly_set_add(local_68,pplVar1[(long)plVar12],'\0',(uint32_t *)0x0);
    plVar12 = (lys_module *)((long)&plVar12->ctx + 1);
    out = local_50;
    if (LVar4 != LY_SUCCESS) break;
LAB_0013f16c:
    pplVar1 = plVar5->augmented_by;
    if (pplVar1 == (lys_module **)0x0) {
      plVar9 = (lys_module *)0x0;
    }
    else {
      plVar9 = pplVar1[-1];
    }
    if (plVar9 <= plVar12) {
      LVar4 = LY_SUCCESS;
      plVar10 = local_38;
      lybctx = local_58;
      out = local_50;
      goto LAB_0013f1b2;
    }
  }
LAB_0013f225:
  bVar2 = false;
  lybctx = local_58;
LAB_0013f22f:
  if (!bVar2) goto LAB_0013f2b3;
  plVar10 = (lyd_node_inner *)(local_60->field_0).node.next;
  plVar3 = plVar10;
  if (plVar10 == (lyd_node_inner *)0x0) goto LAB_0013f24d;
  goto LAB_0013f0fd;
}

Assistant:

LY_ERR
lyb_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t zero = 0;
    struct lyd_lyb_ctx *lybctx;
    const struct ly_ctx *ctx = root ? LYD_CTX(root) : NULL;

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_GOTO(!lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);
    lybctx->lybctx = calloc(1, sizeof *lybctx->lybctx);
    LY_CHECK_ERR_GOTO(!lybctx->lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);

    lybctx->print_options = options;
    if (root) {
        lybctx->lybctx->ctx = ctx;

        if (root->schema && lysc_data_parent(root->schema)) {
            LOGERR(lybctx->lybctx->ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* LYB magic number */
    LY_CHECK_GOTO(ret = lyb_print_magic_number(out), cleanup);

    /* LYB header */
    LY_CHECK_GOTO(ret = lyb_print_header(out), cleanup);

    /* all used models */
    LY_CHECK_GOTO(ret = lyb_print_data_models(out, root, lybctx->lybctx), cleanup);

    ret = lyb_print_siblings(out, root, lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* ending zero byte */
    LY_CHECK_GOTO(ret = lyb_write(out, &zero, sizeof zero, lybctx->lybctx), cleanup);

cleanup:
    lyd_lyb_ctx_free((struct lyd_ctx *)lybctx);
    return ret;
}